

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zeFabricVertexGetExp
          (ze_driver_handle_t hDriver,uint32_t *pCount,ze_fabric_vertex_handle_t *phVertices)

{
  ze_pfnFabricVertexGetExp_t p_Var1;
  ze_result_t zVar2;
  object_t<_ze_fabric_vertex_handle_t_*> *poVar3;
  ulong uVar4;
  long lVar5;
  dditable_t *dditable;
  dditable_t *local_38;
  
  local_38 = *(dditable_t **)(hDriver + 8);
  p_Var1 = (local_38->ze).FabricVertexExp.pfnGetExp;
  if (p_Var1 == (ze_pfnFabricVertexGetExp_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(ze_driver_handle_t *)hDriver,pCount,phVertices);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      zVar2 = ZE_RESULT_SUCCESS;
      if (phVertices != (ze_fabric_vertex_handle_t *)0x0) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          if (*pCount <= uVar4) {
            return ZE_RESULT_SUCCESS;
          }
          poVar3 = singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
                   ::getInstance<_ze_fabric_vertex_handle_t*&,dditable_t*&>
                             ((singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
                               *)(context + 0x360),
                              (_ze_fabric_vertex_handle_t **)((long)phVertices + lVar5),&local_38);
          phVertices[uVar4] = (ze_fabric_vertex_handle_t)poVar3;
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 8;
          zVar2 = ZE_RESULT_SUCCESS;
        } while (phVertices != (ze_fabric_vertex_handle_t *)0x0);
      }
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricVertexGetExp(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of fabric vertices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of fabric vertices available.
                                                        ///< if count is greater than the number of fabric vertices available, then
                                                        ///< the driver shall update the value with the correct number of fabric
                                                        ///< vertices available.
        ze_fabric_vertex_handle_t* phVertices           ///< [in,out][optional][range(0, *pCount)] array of handle of fabric vertices.
                                                        ///< if count is less than the number of fabric vertices available, then
                                                        ///< driver shall only retrieve that number of fabric vertices.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_driver_object_t*>( hDriver )->dditable;
        auto pfnGetExp = dditable->ze.FabricVertexExp.pfnGetExp;
        if( nullptr == pfnGetExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<ze_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnGetExp( hDriver, pCount, phVertices );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phVertices ) && ( i < *pCount ); ++i )
                phVertices[ i ] = reinterpret_cast<ze_fabric_vertex_handle_t>(
                    context->ze_fabric_vertex_factory.getInstance( phVertices[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }